

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_torrent.cpp
# Opt level: O1

string * libtorrent::aux::get_symlink_path(string *__return_storage_ptr__,string *p)

{
  uint uVar1;
  ssize_t sVar2;
  char *s;
  string f;
  char buf [200];
  allocator<char> local_119;
  string local_118;
  native_path_string local_f8;
  libtorrent local_d8 [208];
  
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,(p->_M_dataplus)._M_p,&local_119);
  convert_to_native_path_string(&local_f8,&local_118);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  sVar2 = readlink(local_f8._M_dataplus._M_p,(char *)local_d8,200);
  uVar1 = (uint)sVar2;
  if ((int)uVar1 < 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    if ((int)uVar1 < 200) {
      local_d8[uVar1 & 0x7fffffff] = (libtorrent)0x0;
    }
    else {
      local_d8[0] = (libtorrent)0x0;
    }
    convert_from_native_path_abi_cxx11_(__return_storage_ptr__,local_d8,s);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string get_symlink_path(std::string const& p)
	{
#if defined TORRENT_WINDOWS
		TORRENT_UNUSED(p);
		return "";
#else
		return get_symlink_path_impl(p.c_str());
#endif
	}